

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perror.c
# Opt level: O1

void perror(char *__s)

{
  int *piVar1;
  
  mtx_lock(&stderr->mtx);
  if ((__s != (char *)0x0) && (*__s != '\n')) {
    fprintf((FILE *)stderr,"%s: ",__s);
  }
  piVar1 = _PDCLIB_errno_func();
  if (*piVar1 < 0x84) {
    piVar1 = _PDCLIB_errno_func();
    if (-1 < *piVar1) {
      perror_cold_1();
      goto LAB_00103537;
    }
  }
  perror_cold_2();
LAB_00103537:
  mtx_unlock(&stderr->mtx);
  return;
}

Assistant:

void perror( const char * s )
{
    _PDCLIB_LOCK( stderr->mtx );

    if ( ( s != NULL ) && ( s[0] != '\n' ) )
    {
        fprintf( stderr, "%s: ", s );
    }

    if ( errno >= _PDCLIB_ERRNO_MAX || errno < 0 )
    {
        fprintf( stderr, "%s\n", _PDCLIB_EUNKNOWN_TEXT );
    }
    else
    {
        fprintf( stderr, "%s\n", _PDCLIB_lc_messages->errno_texts[errno] );
    }

    _PDCLIB_UNLOCK( stderr->mtx );
    return;
}